

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int ucstricmp8(char *utf8,char *utf8end,QChar *utf16,QChar *utf16end)

{
  char16_t cVar1;
  char16_t *pcVar2;
  char32_t cVar3;
  char32_t cVar4;
  QChar *pQVar5;
  
  do {
    if ((utf8end <= utf8) || (utf16end <= utf16)) {
      return (uint)(utf8 < utf8end) - (uint)(utf16 < utf16end);
    }
    if (*utf8 < '\0') {
      cVar3 = L'�';
    }
    else {
      cVar3 = QChar::toCaseFolded((uint)(byte)*utf8);
    }
    pQVar5 = utf16 + 1;
    cVar1 = utf16->ucs;
    cVar4 = (char32_t)(ushort)cVar1;
    if (((((cVar1 & 0xf800U) == 0xd800) && (cVar4 = L'�', (cVar1 & 0xdc00U) == 0xd800)) &&
        (pQVar5 < utf16end)) && (pcVar2 = &pQVar5->ucs, (*pcVar2 & 0xfc00U) == 0xdc00)) {
      pQVar5 = utf16 + 2;
      cVar4 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)*pcVar2 + L'\xfca02400';
    }
    cVar4 = QChar::toCaseFolded(cVar4);
    utf8 = (char *)((byte *)utf8 + 1);
    utf16 = pQVar5;
  } while (cVar3 - cVar4 == 0);
  return cVar3 - cVar4;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp8(const char *utf8, const char *utf8end, const QChar *utf16, const QChar *utf16end)
{
    auto src1 = reinterpret_cast<const uchar *>(utf8);
    auto end1 = reinterpret_cast<const uchar *>(utf8end);
    QStringIterator src2(utf16, utf16end);

    while (src1 < end1 && src2.hasNext()) {
        char32_t decoded[1];
        char32_t *output = decoded;
        char32_t &uc1 = decoded[0];
        uchar b = *src1++;
        const qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        } else {
            uc1 = QChar::toCaseFolded(uc1);
        }

        char32_t uc2 = QChar::toCaseFolded(src2.next());
        int diff = uc1 - uc2;   // can't underflow
        if (diff)
            return diff;
    }

    // the shorter string sorts first
    return (end1 > src1) - int(src2.hasNext());
}